

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateEmitExprCode(jx9_gen_state *pGen,jx9_expr_node *pNode,sxi32 iFlags)

{
  void *pvVar1;
  sxi32 sVar2;
  sxu32 sVar3;
  int local_84;
  sxi32 n_1;
  jx9_expr_node **apNode_1;
  sxi32 n;
  jx9_expr_node **apNode;
  sxu32 nJmp;
  sxu32 nJz;
  SyToken *pTmpEnd;
  SyToken *pTmpIn;
  sxi32 rc;
  sxi32 iVmOp;
  void *p3;
  sxu32 local_38;
  sxu32 iP2;
  sxi32 iP1;
  sxu32 nJmpIdx;
  VmInstr *pInstr;
  jx9_expr_node *pjStack_20;
  sxi32 iFlags_local;
  jx9_expr_node *pNode_local;
  jx9_gen_state *pGen_local;
  
  local_38 = 0;
  p3._4_4_ = 0;
  _rc = (void *)0x0;
  pInstr._4_4_ = iFlags;
  pjStack_20 = pNode;
  pNode_local = (jx9_expr_node *)pGen;
  if (pNode->xCode == (ProcNodeConstruct)0x0) {
    if (pNode->pOp == (jx9_expr_op *)0x0) {
      jx9GenCompileError(pGen,1,pNode->pStart->nLine,
                         "Invalid expression node, JX9 is aborting compilation");
      pGen_local._4_4_ = -10;
    }
    else {
      pTmpIn._4_4_ = pNode->pOp->iVmOp;
      if (pNode->pOp->iOp == 0x26) {
        pTmpIn._0_4_ = GenStateEmitExprCode(pGen,pNode->pCond,iFlags);
        pGen_local._4_4_ = (sxi32)pTmpIn;
        if ((sxi32)pTmpIn == 0) {
          apNode._0_4_ = 0;
          apNode._4_4_ = 0;
          jx9VmEmitInstr((jx9_vm *)pNode_local->pOp,9,0,0,(void *)0x0,(sxu32 *)((long)&apNode + 4));
          if (pjStack_20->pLeft != (jx9_expr_node *)0x0) {
            sVar2 = GenStateEmitExprCode
                              ((jx9_gen_state *)pNode_local,pjStack_20->pLeft,pInstr._4_4_);
            if (sVar2 != 0) {
              return sVar2;
            }
            pTmpIn._0_4_ = 0;
          }
          jx9VmEmitInstr((jx9_vm *)pNode_local->pOp,8,0,0,(void *)0x0,(sxu32 *)&apNode);
          _iP1 = jx9VmGetInstr((jx9_vm *)pNode_local->pOp,apNode._4_4_);
          if (_iP1 != (VmInstr *)0x0) {
            sVar3 = jx9VmInstrLength((jx9_vm *)pNode_local->pOp);
            _iP1->iP2 = sVar3;
          }
          if (pjStack_20->pRight != (jx9_expr_node *)0x0) {
            sVar2 = GenStateEmitExprCode
                              ((jx9_gen_state *)pNode_local,pjStack_20->pRight,pInstr._4_4_);
            if (sVar2 != 0) {
              return sVar2;
            }
            pTmpIn._0_4_ = 0;
          }
          if (((sxu32)apNode != 0) &&
             (_iP1 = jx9VmGetInstr((jx9_vm *)pNode_local->pOp,(sxu32)apNode), _iP1 != (VmInstr *)0x0
             )) {
            sVar3 = jx9VmInstrLength((jx9_vm *)pNode_local->pOp);
            _iP1->iP2 = sVar3;
          }
          pGen_local._4_4_ = 0;
        }
      }
      else {
        if (pNode->pLeft != (jx9_expr_node *)0x0) {
          if (pTmpIn._4_4_ == 0x10) {
            pvVar1 = (pNode->aNodeArgs).pBase;
            pInstr._4_4_ = iFlags | 2;
            for (apNode_1._4_4_ = 0; apNode_1._4_4_ < (int)(pjStack_20->aNodeArgs).nUsed;
                apNode_1._4_4_ = apNode_1._4_4_ + 1) {
              sVar2 = GenStateEmitExprCode
                                ((jx9_gen_state *)pNode_local,
                                 *(jx9_expr_node **)((long)pvVar1 + (long)apNode_1._4_4_ * 8),
                                 pInstr._4_4_ & 0xfffffffe);
              if (sVar2 != 0) {
                return sVar2;
              }
              pTmpIn._0_4_ = 0;
            }
            local_38 = (pjStack_20->aNodeArgs).nUsed;
            pInstr._4_4_ = pInstr._4_4_ & 0xfffffffd;
          }
          pTmpIn._0_4_ = GenStateEmitExprCode
                                   ((jx9_gen_state *)pNode_local,pjStack_20->pLeft,pInstr._4_4_);
          if ((sxi32)pTmpIn != 0) {
            return (sxi32)pTmpIn;
          }
          if (pTmpIn._4_4_ == 0x10) {
            _iP1 = jx9VmPeekInstr((jx9_vm *)pNode_local->pOp);
            if (_iP1 != (VmInstr *)0x0) {
              if (_iP1->iOp == '\x04') {
                _iP1->iP1 = 0;
              }
              else if (_iP1->iOp == '?') {
                _iP1->iP2 = 1;
              }
            }
          }
          else if (pTmpIn._4_4_ == 5) {
            pvVar1 = (pjStack_20->aNodeArgs).pBase;
            for (local_84 = 0; pTmpIn._0_4_ = 0, local_84 < (int)(pjStack_20->aNodeArgs).nUsed;
                local_84 = local_84 + 1) {
              sVar2 = GenStateEmitExprCode
                                ((jx9_gen_state *)pNode_local,
                                 *(jx9_expr_node **)((long)pvVar1 + (long)local_84 * 8),
                                 pInstr._4_4_ & 0xfffffffe);
              if (sVar2 != 0) {
                return sVar2;
              }
            }
            if ((pjStack_20->aNodeArgs).nUsed != 0) {
              local_38 = 1;
            }
            if ((pInstr._4_4_ & 1) != 0) {
              p3._4_4_ = 1;
            }
          }
          else if (pjStack_20->pOp->iOp == 0x33) {
            jx9VmEmitInstr((jx9_vm *)pNode_local->pOp,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
          }
        }
        pTmpIn._0_4_ = 0;
        iP2 = 0;
        if (pjStack_20->pRight != (jx9_expr_node *)0x0) {
          if (pTmpIn._4_4_ == 0x27) {
            jx9VmEmitInstr((jx9_vm *)pNode_local->pOp,9,1,0,(void *)0x0,&iP2);
          }
          else if (pTmpIn._4_4_ == 0x28) {
            jx9VmEmitInstr((jx9_vm *)pNode_local->pOp,10,1,0,(void *)0x0,&iP2);
          }
          else if (pjStack_20->pOp->iPrec == 0x12) {
            pInstr._4_4_ = pInstr._4_4_ | 1;
          }
          pTmpIn._0_4_ = GenStateEmitExprCode
                                   ((jx9_gen_state *)pNode_local,pjStack_20->pRight,pInstr._4_4_);
          if ((pTmpIn._4_4_ == 0x2a) &&
             (_iP1 = jx9VmPeekInstr((jx9_vm *)pNode_local->pOp), _iP1 != (VmInstr *)0x0)) {
            if (_iP1->iOp == '?') {
              p3._4_4_ = 1;
            }
            else {
              if (_iP1->iOp == '\x05') {
                pTmpIn._4_4_ = 0x2b;
                local_38 = _iP1->iP1;
              }
              else {
                _rc = _iP1->p3;
              }
              jx9VmPopInstr((jx9_vm *)pNode_local->pOp);
            }
          }
        }
        if (0 < pTmpIn._4_4_) {
          if (((pTmpIn._4_4_ == 0x31) || (pTmpIn._4_4_ == 0x32)) && ((pjStack_20->iFlags & 1U) != 0)
             ) {
            local_38 = 1;
          }
          jx9VmEmitInstr((jx9_vm *)pNode_local->pOp,pTmpIn._4_4_,local_38,p3._4_4_,_rc,(sxu32 *)0x0)
          ;
          if ((iP2 != 0) &&
             (_iP1 = jx9VmGetInstr((jx9_vm *)pNode_local->pOp,iP2), _iP1 != (VmInstr *)0x0)) {
            sVar3 = jx9VmInstrLength((jx9_vm *)pNode_local->pOp);
            _iP1->iP2 = sVar3;
          }
        }
        pGen_local._4_4_ = (sxi32)pTmpIn;
      }
    }
  }
  else {
    pTmpEnd = pGen->pIn;
    _nJmp = pGen->pEnd;
    pGen->pIn = pNode->pStart;
    pGen->pEnd = pNode->pEnd;
    pGen_local._4_4_ = (*pNode->xCode)(pGen,iFlags);
    pNode_local[3].pEnd = pTmpEnd;
    *(SyToken **)&pNode_local[3].iFlags = _nJmp;
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 GenStateEmitExprCode(
	jx9_gen_state *pGen,  /* Code generator state */
	jx9_expr_node *pNode, /* Root of the expression tree */
	sxi32 iFlags /* Control flags */
	)
{
	VmInstr *pInstr;
	sxu32 nJmpIdx;
	sxi32 iP1 = 0;
	sxu32 iP2 = 0;
	void *p3  = 0;
	sxi32 iVmOp;
	sxi32 rc;
	if( pNode->xCode ){
		SyToken *pTmpIn, *pTmpEnd;
		/* Compile node */
		SWAP_DELIMITER(pGen, pNode->pStart, pNode->pEnd);
		rc = pNode->xCode(&(*pGen), iFlags);
		RE_SWAP_DELIMITER(pGen);
		return rc;
	}
	if( pNode->pOp == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, pNode->pStart->nLine, 
			"Invalid expression node, JX9 is aborting compilation");
		return SXERR_ABORT;
	}
	iVmOp = pNode->pOp->iVmOp;
	if( pNode->pOp->iOp == EXPR_OP_QUESTY ){
		sxu32 nJz, nJmp;
		/* Ternary operator require special handling */
		/* Phase#1: Compile the condition */
		rc = GenStateEmitExprCode(&(*pGen), pNode->pCond, iFlags);
		if( rc != SXRET_OK ){
			return rc;
		}
		nJz = nJmp = 0; /* cc -O6 warning */
		/* Phase#2: Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nJz);
		if( pNode->pLeft ){
			/* Phase#3: Compile the 'then' expression  */
			rc = GenStateEmitExprCode(&(*pGen), pNode->pLeft, iFlags);
			if( rc != SXRET_OK ){
				return rc;
			}
		}
		/* Phase#4: Emit the unconditional jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, 0, 0, &nJmp);
		/* Phase#5: Fix the false jump now the jump destination is resolved. */
		pInstr = jx9VmGetInstr(pGen->pVm, nJz);
		if( pInstr ){
			pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
		}
		/* Phase#6: Compile the 'else' expression */
		if( pNode->pRight ){
			rc = GenStateEmitExprCode(&(*pGen), pNode->pRight, iFlags);
			if( rc != SXRET_OK ){
				return rc;
			}
		}
		if( nJmp > 0 ){
			/* Phase#7: Fix the unconditional jump */
			pInstr = jx9VmGetInstr(pGen->pVm, nJmp);
			if( pInstr ){
				pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
			}
		}
		/* All done */
		return SXRET_OK;
	}
	/* Generate code for the left tree */
	if( pNode->pLeft ){
		if( iVmOp == JX9_OP_CALL ){
			jx9_expr_node **apNode;
			sxi32 n;
			/* Recurse and generate bytecodes for function arguments */
			apNode = (jx9_expr_node **)SySetBasePtr(&pNode->aNodeArgs);
			/* Read-only load */
			iFlags |= EXPR_FLAG_RDONLY_LOAD;
			for( n = 0 ; n < (sxi32)SySetUsed(&pNode->aNodeArgs) ; ++n ){
				rc = GenStateEmitExprCode(&(*pGen), apNode[n], iFlags&~EXPR_FLAG_LOAD_IDX_STORE);
				if( rc != SXRET_OK ){
					return rc;
				}
			}
			/* Total number of given arguments */
			iP1 = (sxi32)SySetUsed(&pNode->aNodeArgs);
			/* Remove stale flags now */
			iFlags &= ~EXPR_FLAG_RDONLY_LOAD;
		}
		rc = GenStateEmitExprCode(&(*pGen), pNode->pLeft, iFlags);
		if( rc != SXRET_OK ){
			return rc;
		}
		if( iVmOp == JX9_OP_CALL ){
			pInstr = jx9VmPeekInstr(pGen->pVm);
			if( pInstr ){
				if ( pInstr->iOp == JX9_OP_LOADC ){
					/* Prevent constant expansion */
					pInstr->iP1 = 0;
				}else if( pInstr->iOp == JX9_OP_MEMBER /* $a.b(1, 2, 3) */  ){
					/* Annonymous function call, flag that */
					pInstr->iP2 = 1;
				}
			}
		}else if( iVmOp == JX9_OP_LOAD_IDX ){
			jx9_expr_node **apNode;
			sxi32 n;
			/* Recurse and generate bytecodes for array index */
			apNode = (jx9_expr_node **)SySetBasePtr(&pNode->aNodeArgs);
			for( n = 0 ; n < (sxi32)SySetUsed(&pNode->aNodeArgs) ; ++n ){
				rc = GenStateEmitExprCode(&(*pGen), apNode[n], iFlags&~EXPR_FLAG_LOAD_IDX_STORE);
				if( rc != SXRET_OK ){
					return rc;
				}
			}
			if( SySetUsed(&pNode->aNodeArgs) > 0 ){
				iP1 = 1; /* Node have an index associated with it */
			}
			if( iFlags & EXPR_FLAG_LOAD_IDX_STORE ){
				/* Create an empty entry when the desired index is not found */
				iP2 = 1;
			}
		}else if( pNode->pOp->iOp == EXPR_OP_COMMA ){
			/* POP the left node */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
		}
	}
	rc = SXRET_OK;
	nJmpIdx = 0;
	/* Generate code for the right tree */
	if( pNode->pRight ){
		if( iVmOp == JX9_OP_LAND ){
			/* Emit the false jump so we can short-circuit the logical and */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 1/* Keep the value on the stack */, 0, 0, &nJmpIdx);
		}else if (iVmOp == JX9_OP_LOR ){
			/* Emit the true jump so we can short-circuit the logical or*/
			jx9VmEmitInstr(pGen->pVm, JX9_OP_JNZ, 1/* Keep the value on the stack */, 0, 0, &nJmpIdx);
		}else if( pNode->pOp->iPrec == 18 /* Combined binary operators [i.e: =, '.=', '+=', *=' ...] precedence */ ){
			iFlags |= EXPR_FLAG_LOAD_IDX_STORE;
		}
		rc = GenStateEmitExprCode(&(*pGen), pNode->pRight, iFlags);
		if( iVmOp == JX9_OP_STORE ){
			pInstr = jx9VmPeekInstr(pGen->pVm);
			if( pInstr ){
				if(pInstr->iOp == JX9_OP_MEMBER ){
					/* Perform a member store operation [i.e: $this.x = 50] */
					iP2 = 1;
				}else{
					if( pInstr->iOp == JX9_OP_LOAD_IDX ){
						/* Transform the STORE instruction to STORE_IDX instruction */
						iVmOp = JX9_OP_STORE_IDX;
						iP1 = pInstr->iP1;
					}else{
						p3 = pInstr->p3;
					}
					/* POP the last dynamic load instruction */
					(void)jx9VmPopInstr(pGen->pVm);
				}
			}
		}
	}
	if( iVmOp > 0 ){
		if( iVmOp == JX9_OP_INCR || iVmOp == JX9_OP_DECR ){
			if( pNode->iFlags & EXPR_NODE_PRE_INCR ){
				/* Pre-increment/decrement operator [i.e: ++$i, --$j ] */
				iP1 = 1;
			}
		}
		/* Finally, emit the VM instruction associated with this operator */
		jx9VmEmitInstr(pGen->pVm, iVmOp, iP1, iP2, p3, 0);
		if( nJmpIdx > 0 ){
			/* Fix short-circuited jumps now the destination is resolved */
			pInstr = jx9VmGetInstr(pGen->pVm, nJmpIdx);
			if( pInstr ){
				pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
			}
		}
	}
	return rc;
}